

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ffql_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  fpr_t *pfVar2;
  uint uVar3;
  float32 fVar4;
  float64 fVar5;
  long lVar6;
  float_status *status;
  wr_t wx;
  float64 local_48 [3];
  
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar4 = float32_from_q16(*(int16_t *)
                                ((long)(env->active_fpu).fpr + lVar6 * 2 + (ulong)ws * 0x10 + 8),
                               pfVar1);
      *(float32 *)((long)local_48 + lVar6 * 4) = fVar4;
      uVar3 = update_msacsr(env,0,(uint)((fVar4 & 0x7f800000) == 0 && (fVar4 & 0x7fffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar3) != 0) {
        fVar4 = float32_default_nan_mips64(pfVar1);
        *(float32 *)((long)local_48 + lVar6 * 4) = fVar4 & 0xffffffc0 ^ 0x400000 | uVar3;
      }
    }
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c5f,
                    "void helper_msa_ffql_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar1 = &(env->active_tc).msa_fp_status;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar5 = float64_from_q32(*(int32_t *)
                                ((long)(env->active_fpu).fpr + lVar6 * 4 + (ulong)ws * 0x10 + 8),
                               pfVar1);
      local_48[lVar6] = fVar5;
      uVar3 = update_msacsr(env,0,(uint)((fVar5 & 0x7ff0000000000000) == 0 &&
                                        (fVar5 & 0x7fffffffffffffff) != 0));
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar3) != 0) {
        fVar5 = float64_default_nan_mips64(pfVar1);
        local_48[lVar6] = (long)(int)uVar3 | fVar5 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
    }
  }
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48[0];
  (&pfVar2->fd)[1] = local_48[1];
  return;
}

Assistant:

void helper_msa_ffql_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Lh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}